

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O1

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  ushort uVar1;
  AF_Blue_Stringset AVar2;
  FT_CharMap charmap;
  FT_GlyphSlot_conflict pFVar3;
  FT_Vector *pFVar4;
  FT_Error FVar5;
  AF_Blue_String AVar6;
  uint uVar7;
  long *buf_;
  AF_CJKAxisRec *pAVar8;
  ulong uVar9;
  AF_CJKBlueRec *pAVar10;
  AF_Blue_StringRec *pAVar11;
  long lVar12;
  FT_Pos FVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  FT_Pos *pFVar21;
  FT_Vector *pFVar22;
  char *p;
  uint uVar23;
  ulong uVar24;
  long lStack_3c8;
  FT_Pos flats [51];
  long local_228;
  FT_Pos fills [51];
  uint local_4c;
  ulong local_48;
  long *local_40;
  undefined4 local_34;
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar5 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar5 == 0) {
    af_cjk_metrics_init_widths(metrics,face);
    AVar2 = ((metrics->root).style_class)->blue_stringset;
    buf_ = (long *)ft_mem_alloc(face->memory,8,(FT_Error *)&local_228);
    AVar6 = af_blue_stringsets[AVar2].string;
    if (AVar6 != AF_BLUE_STRING_MAX) {
      pAVar11 = af_blue_stringsets + AVar2;
      local_40 = buf_;
      do {
        uVar1 = pAVar11->properties;
        pAVar8 = metrics->axis;
        if ((uVar1 & 2) == 0) {
          pAVar8 = metrics->axis + 1;
        }
        local_48 = 0;
        uVar23 = 0;
        if (af_blue_strings[AVar6] != '\0') {
          p = af_blue_strings + AVar6;
          local_34 = 0x26b701;
          uVar24 = 0;
          local_48 = 0;
          do {
            for (; *p == ' '; p = p + 1) {
            }
            if (*p == '|') {
              p = p + 1;
              local_34 = 0;
            }
            else {
              p = af_shaper_get_cluster(p,&metrics->root,buf_,&local_4c);
              if ((((local_4c < 2) && (*buf_ != 0)) &&
                  (FVar5 = FT_Load_Glyph(face,(FT_UInt)*buf_,1), buf_ = local_40, FVar5 == 0)) &&
                 (pFVar3 = face->glyph, 2 < (pFVar3->outline).n_points)) {
                lVar14 = (long)(pFVar3->outline).n_contours;
                if (lVar14 < 1) {
                  lVar12 = 0;
                }
                else {
                  pFVar4 = (pFVar3->outline).points;
                  iVar16 = -1;
                  lVar15 = 0;
                  iVar18 = 0;
                  lVar12 = 0;
                  do {
                    iVar19 = (int)(pFVar3->outline).contours[lVar15];
                    if (iVar18 < iVar19) {
                      lVar20 = (long)iVar18;
                      if ((uVar1 & 2) == 0) {
                        pFVar21 = &pFVar4[lVar20].y;
                        lVar20 = (iVar19 - lVar20) + 1;
                        if ((uVar1 & 1) == 0) {
                          do {
                            if ((iVar16 < 0) || (*pFVar21 < lVar12)) {
                              lVar12 = *pFVar21;
                              iVar16 = iVar18;
                            }
                            iVar18 = iVar18 + 1;
                            pFVar21 = pFVar21 + 2;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                        else {
                          do {
                            if ((iVar16 < 0) || (lVar12 < *pFVar21)) {
                              lVar12 = *pFVar21;
                              iVar16 = iVar18;
                            }
                            iVar18 = iVar18 + 1;
                            pFVar21 = pFVar21 + 2;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                      }
                      else {
                        pFVar22 = pFVar4 + lVar20;
                        lVar20 = (iVar19 - lVar20) + 1;
                        if ((uVar1 & 1) == 0) {
                          do {
                            if ((iVar16 < 0) || (pFVar22->x < lVar12)) {
                              lVar12 = pFVar22->x;
                              iVar16 = iVar18;
                            }
                            iVar18 = iVar18 + 1;
                            pFVar22 = pFVar22 + 1;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                        else {
                          do {
                            if ((iVar16 < 0) || (lVar12 < pFVar22->x)) {
                              lVar12 = pFVar22->x;
                              iVar16 = iVar18;
                            }
                            iVar18 = iVar18 + 1;
                            pFVar22 = pFVar22 + 1;
                            lVar20 = lVar20 + -1;
                          } while (lVar20 != 0);
                        }
                      }
                    }
                    iVar18 = iVar19 + 1;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != lVar14);
                }
                if ((char)local_34 == '\0') {
                  uVar9 = local_48 & 0xffffffff;
                  local_48 = (ulong)((int)local_48 + 1);
                  flats[uVar9 - 1] = lVar12;
                  buf_ = local_40;
                }
                else {
                  fills[uVar24 - 1] = lVar12;
                  buf_ = local_40;
                  uVar24 = (ulong)((int)uVar24 + 1);
                }
              }
            }
            uVar23 = (uint)uVar24;
          } while (*p != '\0');
        }
        uVar17 = (uint)local_48;
        if (uVar17 != 0 || uVar23 != 0) {
          if (1 < uVar23) {
            uVar7 = 1;
            do {
              uVar24 = (ulong)uVar7;
              do {
                lVar14 = fills[uVar24 - 1];
                uVar9 = (ulong)((int)uVar24 - 1);
                if (fills[uVar9 - 1] <= lVar14) break;
                fills[uVar24 - 1] = fills[uVar9 - 1];
                fills[uVar9 - 1] = lVar14;
                uVar24 = uVar9;
              } while (uVar9 != 0);
              uVar7 = uVar7 + 1;
            } while (uVar7 != uVar23);
          }
          if (1 < uVar17) {
            uVar7 = 1;
            do {
              uVar24 = (ulong)uVar7;
              do {
                lVar14 = flats[uVar24 - 1];
                uVar9 = (ulong)((int)uVar24 - 1);
                if (flats[uVar9 - 1] <= lVar14) break;
                flats[uVar24 - 1] = flats[uVar9 - 1];
                flats[uVar9 - 1] = lVar14;
                uVar24 = uVar9;
              } while (uVar9 != 0);
              uVar7 = uVar7 + 1;
            } while (uVar7 != uVar17);
          }
          uVar7 = pAVar8->blue_count;
          pAVar10 = pAVar8->blues + uVar7;
          pAVar8->blue_count = uVar7 + 1;
          if (uVar17 == 0) {
            FVar13 = fills[(ulong)(uVar23 >> 1) - 1];
LAB_0023a7dc:
            pAVar8->blues[uVar7].shoot.org = FVar13;
            (pAVar10->ref).org = FVar13;
          }
          else {
            if (uVar23 == 0) {
              FVar13 = flats[(ulong)(uVar17 >> 1) - 1];
              goto LAB_0023a7dc;
            }
            (pAVar10->ref).org = fills[(ulong)(uVar23 >> 1) - 1];
            pAVar8->blues[uVar7].shoot.org = flats[(ulong)(uVar17 >> 1) - 1];
          }
          lVar14 = (pAVar10->ref).org;
          lVar12 = pAVar8->blues[uVar7].shoot.org;
          if ((lVar12 != lVar14) && (((lVar14 <= lVar12 ^ (byte)uVar1) & 1) == 0)) {
            lVar14 = (lVar14 + lVar12) / 2;
            pAVar8->blues[uVar7].shoot.org = lVar14;
            (pAVar10->ref).org = lVar14;
          }
          pAVar8->blues[uVar7].flags = (uint)uVar1 * 2 & 2;
        }
        AVar6 = pAVar11[1].string;
        pAVar11 = pAVar11 + 1;
      } while (AVar6 != AF_BLUE_STRING_MAX);
    }
    ft_mem_free(face->memory,buf_);
    af_cjk_metrics_check_digits(metrics,face);
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }